

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::torrent::on_name_lookup
          (torrent *this,error_code *e,
          vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_> *addrs,
          int port,iterator web)

{
  vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_> *this_00;
  bool bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  undefined8 uVar5;
  pointer pwVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined8 uVar7;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  session_settings *psVar8;
  reference other;
  endpoint *ep;
  basic_endpoint<boost::asio::ip::tcp> local_12c;
  iterator local_110;
  error_code_enum local_104;
  undefined1 local_100 [48];
  string local_d0;
  unsigned_short local_aa;
  _Head_base<0UL,_libtorrent::aux::peer_list_*,_false> local_a8;
  address *addr;
  const_iterator __end2;
  const_iterator __begin2;
  vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_> *__range2;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<1L,_1L>_>_>
  local_80;
  duration local_7c;
  string local_78;
  undefined1 local_58 [52];
  int port_local;
  vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_> *addrs_local;
  error_code *e_local;
  torrent *this_local;
  iterator web_local;
  
  local_58._44_4_ = port;
  unique0x100007c6 = addrs;
  addrs_local = (vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_> *)e;
  e_local = (error_code *)this;
  this_local = (torrent *)web._M_node;
  ::std::_List_iterator<libtorrent::aux::web_seed_t>::operator->
            ((_List_iterator<libtorrent::aux::web_seed_t> *)&this_local);
  uVar5 = ::std::__cxx11::string::c_str();
  (*(this->super_request_callback)._vptr_request_callback[7])(this,"completed resolve: %s",uVar5);
  pwVar6 = ::std::_List_iterator<libtorrent::aux::web_seed_t>::operator->
                     ((_List_iterator<libtorrent::aux::web_seed_t> *)&this_local);
  pwVar6->resolving = false;
  pwVar6 = ::std::_List_iterator<libtorrent::aux::web_seed_t>::operator->
                     ((_List_iterator<libtorrent::aux::web_seed_t> *)&this_local);
  if ((pwVar6->removed & 1U) == 0) {
    if ((*(ulong *)&(this->super_torrent_hot_members).field_0x48 >> 0x1a & 1) == 0) {
      bVar1 = boost::system::error_code::operator_cast_to_bool((error_code *)addrs_local);
      if ((bVar1) ||
         (bVar1 = ::std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>
                  ::empty(stack0xffffffffffffffd8), this_00 = stack0xffffffffffffffd8, bVar1)) {
        iVar3 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                  _vptr_session_logger[5])();
        bVar1 = alert_manager::should_post<libtorrent::url_seed_alert>
                          ((alert_manager *)CONCAT44(extraout_var,iVar3));
        if (bVar1) {
          iVar3 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                    _vptr_session_logger[5])();
          get_handle((torrent *)local_58);
          pwVar6 = ::std::_List_iterator<libtorrent::aux::web_seed_t>::operator->
                             ((_List_iterator<libtorrent::aux::web_seed_t> *)&this_local);
          alert_manager::
          emplace_alert<libtorrent::url_seed_alert,libtorrent::torrent_handle,std::__cxx11::string&,boost::system::error_code_const&>
                    ((alert_manager *)CONCAT44(extraout_var_00,iVar3),(torrent_handle *)local_58,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pwVar6,
                     (error_code *)addrs_local);
          torrent_handle::~torrent_handle((torrent_handle *)local_58);
        }
        uVar2 = (*(this->super_request_callback)._vptr_request_callback[6])();
        if ((uVar2 & 1) != 0) {
          ::std::_List_iterator<libtorrent::aux::web_seed_t>::operator->
                    ((_List_iterator<libtorrent::aux::web_seed_t> *)&this_local);
          uVar5 = ::std::__cxx11::string::c_str();
          uVar2 = boost::system::error_code::value((error_code *)addrs_local);
          boost::system::error_code::message_abi_cxx11_(&local_78,(error_code *)addrs_local);
          uVar7 = ::std::__cxx11::string::c_str();
          (*(this->super_request_callback)._vptr_request_callback[7])
                    (this,"*** HOSTNAME LOOKUP FAILED: %s: (%d) %s",uVar5,(ulong)uVar2,uVar7);
          ::std::__cxx11::string::~string((string *)&local_78);
        }
        local_80.__d.__r = (duration)time_now32();
        psVar8 = settings(this);
        __range2._0_4_ = session_settings::get_int(psVar8,0x4080);
        ::std::chrono::duration<int,std::ratio<1l,1l>>::duration<int,void>
                  ((duration<int,std::ratio<1l,1l>> *)((long)&__range2 + 4),(int *)&__range2);
        local_7c.__r = (rep_conflict)
                       ::std::chrono::operator+
                                 (&local_80,
                                  (duration<int,_std::ratio<1L,_1L>_> *)((long)&__range2 + 4));
        pwVar6 = ::std::_List_iterator<libtorrent::aux::web_seed_t>::operator->
                           ((_List_iterator<libtorrent::aux::web_seed_t> *)&this_local);
        *(rep_conflict *)&(pwVar6->super_web_seed_entry).field_0x5c = local_7c.__r;
      }
      else {
        __end2 = ::std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>
                 ::begin(stack0xffffffffffffffd8);
        addr = (address *)
               ::std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>::
               end(this_00);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end2,(__normal_iterator<const_boost::asio::ip::address_*,_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_>
                                           *)&addr), bVar1) {
          local_a8._M_head_impl =
               (peer_list *)
               __gnu_cxx::
               __normal_iterator<const_boost::asio::ip::address_*,_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_>
               ::operator*(&__end2);
          pwVar6 = ::std::_List_iterator<libtorrent::aux::web_seed_t>::operator->
                             ((_List_iterator<libtorrent::aux::web_seed_t> *)&this_local);
          if (((pwVar6->no_local_ips & 1U) == 0) ||
             (bVar1 = is_global((address *)local_a8._M_head_impl), bVar1)) {
            pwVar6 = ::std::_List_iterator<libtorrent::aux::web_seed_t>::operator->
                               ((_List_iterator<libtorrent::aux::web_seed_t> *)&this_local);
            local_aa = local_58._44_2_;
            ::std::
            vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>>
            ::emplace_back<boost::asio::ip::address_const&,unsigned_short>
                      ((vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>>
                        *)&pwVar6->endpoints,(address *)local_a8._M_head_impl,&local_aa);
            uVar2 = (*(this->super_request_callback)._vptr_request_callback[6])();
            if ((uVar2 & 1) != 0) {
              boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::basic_endpoint
                        ((basic_endpoint<boost::asio::ip::tcp> *)(local_100 + 0x14),
                         (address *)local_a8._M_head_impl,local_58._44_2_);
              print_endpoint_abi_cxx11_(&local_d0,(aux *)(local_100 + 0x14),ep);
              uVar5 = ::std::__cxx11::string::c_str();
              (*(this->super_request_callback)._vptr_request_callback[7])(this,"  -> %s",uVar5);
              ::std::__cxx11::string::~string((string *)&local_d0);
            }
          }
          __gnu_cxx::
          __normal_iterator<const_boost::asio::ip::address_*,_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_>
          ::operator++(&__end2);
        }
        pwVar6 = ::std::_List_iterator<libtorrent::aux::web_seed_t>::operator->
                           ((_List_iterator<libtorrent::aux::web_seed_t> *)&this_local);
        bVar1 = ::std::
                vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
                ::empty(&pwVar6->endpoints);
        if (bVar1) {
          iVar3 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                    _vptr_session_logger[5])();
          bVar1 = alert_manager::should_post<libtorrent::url_seed_alert>
                            ((alert_manager *)CONCAT44(extraout_var_01,iVar3));
          if (bVar1) {
            iVar3 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                      _vptr_session_logger[5])();
            get_handle((torrent *)local_100);
            pwVar6 = ::std::_List_iterator<libtorrent::aux::web_seed_t>::operator->
                               ((_List_iterator<libtorrent::aux::web_seed_t> *)&this_local);
            local_104 = banned_by_ip_filter;
            alert_manager::
            emplace_alert<libtorrent::url_seed_alert,libtorrent::torrent_handle,std::__cxx11::string&,libtorrent::errors::error_code_enum>
                      ((alert_manager *)CONCAT44(extraout_var_02,iVar3),(torrent_handle *)local_100,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pwVar6,
                       &local_104);
            torrent_handle::~torrent_handle((torrent_handle *)local_100);
          }
          pwVar6 = ::std::_List_iterator<libtorrent::aux::web_seed_t>::operator->
                             ((_List_iterator<libtorrent::aux::web_seed_t> *)&this_local);
          pwVar6->disabled = true;
        }
        else {
          iVar3 = num_peers(this);
          if (iVar3 < (int)((uint)((ulong)*(undefined8 *)
                                           &(this->super_torrent_hot_members).field_0x48 >> 0x21) &
                           0xffffff)) {
            iVar3 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                      _vptr_session_logger[0x1e])();
            psVar8 = settings(this);
            iVar4 = session_settings::get_int(psVar8,0x4055);
            if (iVar3 < iVar4) {
              local_110._M_node = (_List_node_base *)this_local;
              pwVar6 = ::std::_List_iterator<libtorrent::aux::web_seed_t>::operator->
                                 ((_List_iterator<libtorrent::aux::web_seed_t> *)&this_local);
              other = ::std::
                      vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
                      ::front(&pwVar6->endpoints);
              boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::basic_endpoint
                        (&local_12c,other);
              connect_web_seed(this,local_110,&local_12c);
            }
          }
        }
      }
    }
  }
  else {
    (*(this->super_request_callback)._vptr_request_callback[7])(this,"removed web seed");
    local_58._32_8_ = this_local;
    remove_web_seed_iter(this,(iterator)this_local);
  }
  return;
}

Assistant:

void torrent::on_name_lookup(error_code const& e
		, std::vector<address> const& addrs
		, int const port
		, std::list<web_seed_t>::iterator web) try
	{
		TORRENT_ASSERT(is_single_thread());

		INVARIANT_CHECK;

		TORRENT_ASSERT(web->resolving);
#ifndef TORRENT_DISABLE_LOGGING
		debug_log("completed resolve: %s", web->url.c_str());
#endif
		web->resolving = false;
		if (web->removed)
		{
#ifndef TORRENT_DISABLE_LOGGING
			debug_log("removed web seed");
#endif
			remove_web_seed_iter(web);
			return;
		}

		if (m_abort) return;

		if (e || addrs.empty())
		{
			if (m_ses.alerts().should_post<url_seed_alert>())
				m_ses.alerts().emplace_alert<url_seed_alert>(get_handle(), web->url, e);
#ifndef TORRENT_DISABLE_LOGGING
			if (should_log())
			{
				debug_log("*** HOSTNAME LOOKUP FAILED: %s: (%d) %s"
					, web->url.c_str(), e.value(), e.message().c_str());
			}
#endif

			// unavailable, retry in `settings_pack::web_seed_name_lookup_retry` seconds
			web->retry = aux::time_now32()
				+ seconds32(settings().get_int(settings_pack::web_seed_name_lookup_retry));
			return;
		}

		for (auto const& addr : addrs)
		{
			// if this is set, we don't allow this web seed to have resolved to a
			// local IP
			if (web->no_local_ips && !aux::is_global(addr)) continue;

			// fill in the peer struct's address field
			web->endpoints.emplace_back(addr, std::uint16_t(port));

#ifndef TORRENT_DISABLE_LOGGING
			if (should_log())
				debug_log("  -> %s", print_endpoint(tcp::endpoint(addr, std::uint16_t(port))).c_str());
#endif
		}

		if (web->endpoints.empty())
		{
			if (m_ses.alerts().should_post<url_seed_alert>())
			{
				m_ses.alerts().emplace_alert<url_seed_alert>(get_handle()
					, web->url, errors::banned_by_ip_filter);
			}

			// the name lookup failed for the http host. Don't try
			// this host again
			web->disabled = true;
			return;
		}

		if (num_peers() >= int(m_max_connections)
			|| m_ses.num_connections() >= settings().get_int(settings_pack::connections_limit))
			return;

		connect_web_seed(web, web->endpoints.front());
	}
	catch (...) { handle_exception(); }